

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

CEPlanet * CEPlanet::Jupiter(void)

{
  CEPlanet *in_RDI;
  CEPlanet *jupiter;
  CEPlanet *angle;
  CEPlanet *this;
  uint in_stack_ffffffffffffff80;
  CEAngle *ycoord;
  CEAngle *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  CEPlanet *this_00;
  undefined1 local_31 [40];
  undefined1 local_9;
  
  local_9 = CIRS;
  this = (CEPlanet *)local_31;
  angle = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"Jupiter",(allocator *)this);
  this_00 = (CEPlanet *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  ycoord = (CEAngle *)0x0;
  CEAngle::CEAngle((CEAngle *)this,(double *)angle);
  CEPlanet(this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,ycoord,
           (CESkyCoordType *)(ulong)in_stack_ffffffffffffff80);
  CEAngle::~CEAngle((CEAngle *)0x13cb21);
  CEAngle::~CEAngle((CEAngle *)0x13cb2b);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  SetSemiMajorAxis_AU(this,(double)angle,(double)in_RDI);
  SetEccentricity(in_RDI,0.0485359,-5.107e-05);
  SetInclination(in_RDI,1.29861416,-0.00322699,DEGREES);
  SetMeanLongitude(in_RDI,34.33479152,3034.90371757,DEGREES);
  SetPerihelionLongitude(in_RDI,14.27495244,0.18199196,DEGREES);
  SetAscendingNodeLongitude(in_RDI,100.29282654,0.13024619,DEGREES);
  SetExtraTerms(in_RDI,-0.00012452,0.0606406,-0.35635438,38.35125);
  SetMeanRadius_m(in_RDI,69911000.0);
  SetAlbedo(in_RDI,0.52);
  SetMass_kg(in_RDI,1.89813e+27);
  SetSofaID(this,(double *)angle);
  return angle;
}

Assistant:

CEPlanet CEPlanet::Jupiter()
{
    CEPlanet jupiter("Jupiter", 0.0, 0.0) ;
    jupiter.SetSemiMajorAxis_AU(5.20248019, -0.00002864) ;
    jupiter.SetEccentricity(0.04853590, -0.00005107) ;
    jupiter.SetInclination(1.29861416, -0.00322699, CEAngleType::DEGREES) ;
    jupiter.SetMeanLongitude(34.33479152, 3034.90371757, CEAngleType::DEGREES) ;
    jupiter.SetPerihelionLongitude(14.27495244, 0.18199196, CEAngleType::DEGREES) ;
    jupiter.SetAscendingNodeLongitude(100.29282654, 0.13024619, CEAngleType::DEGREES) ;
    
    jupiter.SetExtraTerms(-0.00012452, 0.06064060, -0.35635438, 38.35125000) ;
    
    // Set planetary properties
    jupiter.SetMeanRadius_m(69911000.0) ;
    jupiter.SetAlbedo(0.52) ;
    jupiter.SetMass_kg(1.89813E27) ;
    
    // Set the sofa planet ID
    jupiter.SetSofaID(5) ;
    
    return jupiter ;
}